

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hdwallet.cpp
# Opt level: O0

void __thiscall
HDWallet_GeneratePrivkeyTest_Test::HDWallet_GeneratePrivkeyTest_Test
          (HDWallet_GeneratePrivkeyTest_Test *this)

{
  HDWallet_GeneratePrivkeyTest_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__HDWallet_GeneratePrivkeyTest_Test_009dc338;
  return;
}

Assistant:

TEST(HDWallet, GeneratePrivkeyTest) {
  ByteData seed("c55257c360c07c72029aebc1b53c05ed0362ada38ead3e3e9efa3708e53495531f09a6987599d18264c1e1c92f2cf141630c7a3c4ab7c81b2f001698e7463b04");

  HDWallet wallet;
  EXPECT_NO_THROW((wallet = HDWallet(seed)));

  ExtPrivkey privkey;
  EXPECT_NO_THROW((privkey = wallet.GeneratePrivkey(NetType::kMainnet)));
  EXPECT_STREQ(privkey.ToString().c_str(), "xprv9s21ZrQH143K3h3fDYiay8mocZ3afhfULfb5GX8kCBdno77K4HiA15Tg23wpbeF1pLfs1c5SPmYHrEpTuuRhxMwvKDwqdKiGJS9XFKzUsAF");

  EXPECT_NO_THROW((privkey = wallet.GeneratePrivkey(NetType::kTestnet)));
  EXPECT_STREQ(privkey.ToString().c_str(), "tprv8ZgxMBicQKsPeWHBt7a68nPnvgTnuDhUgDWC8wZCgA8GahrQ3f3uWpq7wE7Uc1dLBnCe1hhCZ886K6ND37memRDWqsA9HgSKDXtwh2Qxo6J");

  std::vector<uint32_t> path = {0, 44};
  ExtPrivkey privkey0;
  EXPECT_NO_THROW((privkey0 = wallet.GeneratePrivkey(NetType::kMainnet, path)));
  EXPECT_STREQ(privkey0.ToString().c_str(), "xprv9wiYQ21HNxnQ8FxBjbYjJy5ckuEZ6CAFsKdHEnfkRcw5pZbXAFSturoZugNE6ZpVSu6kdrYw752chFPAbPMXZ62ZLfYwLMHdzMVXqwnfRFn");

  ExtPrivkey privkey1;
  EXPECT_NO_THROW((privkey1 = wallet.GeneratePrivkey(NetType::kMainnet, 0)));
  EXPECT_STREQ(privkey1.ToString().c_str(), "xprv9vEG8CuCbvqnJXhr1ZTHZYJcYqGMZ8dkphAUT2CDZsfqewNpq42oSiFgBXXYwDWAHXVbHew4uBfiHNAahRGJ8kUWwqwTGSXUb4wrbWz9eqo");
  ExtPrivkey privkey2;
  EXPECT_NO_THROW((privkey2 = privkey1.DerivePrivkey(44)));
  EXPECT_STREQ(privkey2.ToString().c_str(), privkey0.ToString().c_str());

  ExtPrivkey privkeyh;
  EXPECT_NO_THROW((privkeyh = wallet.GeneratePrivkey(NetType::kMainnet, "m/0h/44h")));
  EXPECT_STREQ(privkeyh.ToString().c_str(), "xprv9xcgxExFiq8qWLdxFHXpEZF8VH7Qr9YDZb8c7vMsqygWk2YGTBgSnDtm1LESskfAJqGMWkWWGagNCSbHdVgA8EFxSbfAQTKSD1z4iJ8qHtq");

  KeyData keypath1;
  EXPECT_NO_THROW((keypath1 = wallet.GeneratePrivkeyData(NetType::kMainnet, "m/0h/44h")));
  EXPECT_STREQ(keypath1.ToString().c_str(), "[b4e3f5ed/0'/44']035d3d3ee3ce7044686e0eb4697d92478658ac9f854c3c2bccd7a5a8aa74d3fc7a");
  EXPECT_STREQ(keypath1.ToString(false).c_str(), "[b4e3f5ed/0'/44']xprv9xcgxExFiq8qWLdxFHXpEZF8VH7Qr9YDZb8c7vMsqygWk2YGTBgSnDtm1LESskfAJqGMWkWWGagNCSbHdVgA8EFxSbfAQTKSD1z4iJ8qHtq");
  
  std::vector<uint32_t> path2 = {0x80000000, 0x80000000 + 44};
  KeyData keypath2;
  EXPECT_NO_THROW((keypath2 = wallet.GeneratePrivkeyData(NetType::kMainnet, path2)));
  EXPECT_STREQ(keypath2.ToString(false).c_str(), "[b4e3f5ed/0'/44']xprv9xcgxExFiq8qWLdxFHXpEZF8VH7Qr9YDZb8c7vMsqygWk2YGTBgSnDtm1LESskfAJqGMWkWWGagNCSbHdVgA8EFxSbfAQTKSD1z4iJ8qHtq");
}